

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_adds_s_h_mips64el(CPUMIPSState_conflict10 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  short sVar1;
  short sVar2;
  short sVar3;
  long lVar4;
  
  sVar2 = *(short *)((env->active_fpu).fpr + ws);
  lVar4 = (long)sVar2;
  sVar1 = *(short *)((env->active_fpu).fpr + wt);
  sVar2 = sVar1 + sVar2;
  if (lVar4 < 0) {
    sVar3 = -0x8000;
    if (-0x8000 - lVar4 < (long)sVar1) {
      sVar3 = sVar2;
    }
  }
  else {
    sVar3 = 0x7fff;
    if ((long)sVar1 < 0x7fff - lVar4) {
      sVar3 = sVar2;
    }
  }
  *(short *)((env->active_fpu).fpr + wd) = sVar3;
  sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 2);
  lVar4 = (long)sVar2;
  sVar1 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 2);
  sVar2 = sVar1 + sVar2;
  if (lVar4 < 0) {
    sVar3 = -0x8000;
    if (-0x8000 - lVar4 < (long)sVar1) {
      sVar3 = sVar2;
    }
  }
  else {
    sVar3 = 0x7fff;
    if ((long)sVar1 < 0x7fff - lVar4) {
      sVar3 = sVar2;
    }
  }
  *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 2) = sVar3;
  sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4);
  lVar4 = (long)sVar2;
  sVar1 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4);
  sVar2 = sVar1 + sVar2;
  if (lVar4 < 0) {
    sVar3 = -0x8000;
    if (-0x8000 - lVar4 < (long)sVar1) {
      sVar3 = sVar2;
    }
  }
  else {
    sVar3 = 0x7fff;
    if ((long)sVar1 < 0x7fff - lVar4) {
      sVar3 = sVar2;
    }
  }
  *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 4) = sVar3;
  sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 6);
  lVar4 = (long)sVar2;
  sVar1 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 6);
  sVar2 = sVar1 + sVar2;
  if (lVar4 < 0) {
    sVar3 = -0x8000;
    if (-0x8000 - lVar4 < (long)sVar1) {
      sVar3 = sVar2;
    }
  }
  else {
    sVar3 = 0x7fff;
    if ((long)sVar1 < 0x7fff - lVar4) {
      sVar3 = sVar2;
    }
  }
  *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 6) = sVar3;
  sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
  lVar4 = (long)sVar2;
  sVar1 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
  sVar2 = sVar1 + sVar2;
  if (lVar4 < 0) {
    sVar3 = -0x8000;
    if (-0x8000 - lVar4 < (long)sVar1) {
      sVar3 = sVar2;
    }
  }
  else {
    sVar3 = 0x7fff;
    if ((long)sVar1 < 0x7fff - lVar4) {
      sVar3 = sVar2;
    }
  }
  *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = sVar3;
  sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 10);
  lVar4 = (long)sVar2;
  sVar1 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 10);
  sVar2 = sVar1 + sVar2;
  if (lVar4 < 0) {
    sVar3 = -0x8000;
    if (-0x8000 - lVar4 < (long)sVar1) {
      sVar3 = sVar2;
    }
  }
  else {
    sVar3 = 0x7fff;
    if ((long)sVar1 < 0x7fff - lVar4) {
      sVar3 = sVar2;
    }
  }
  *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 10) = sVar3;
  sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc);
  lVar4 = (long)sVar2;
  sVar1 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc);
  sVar2 = sVar1 + sVar2;
  if (lVar4 < 0) {
    sVar3 = -0x8000;
    if (-0x8000 - lVar4 < (long)sVar1) {
      sVar3 = sVar2;
    }
  }
  else {
    sVar3 = 0x7fff;
    if ((long)sVar1 < 0x7fff - lVar4) {
      sVar3 = sVar2;
    }
  }
  *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xc) = sVar3;
  sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xe);
  lVar4 = (long)sVar2;
  sVar1 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xe);
  sVar2 = sVar1 + sVar2;
  if (lVar4 < 0) {
    sVar3 = -0x8000;
    if (-0x8000 - lVar4 < (long)sVar1) {
      sVar3 = sVar2;
    }
  }
  else {
    sVar3 = 0x7fff;
    if ((long)sVar1 < 0x7fff - lVar4) {
      sVar3 = sVar2;
    }
  }
  *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xe) = sVar3;
  return;
}

Assistant:

void helper_msa_adds_s_h(CPUMIPSState *env,
                         uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->h[0]  = msa_adds_s_df(DF_HALF, pws->h[0],  pwt->h[0]);
    pwd->h[1]  = msa_adds_s_df(DF_HALF, pws->h[1],  pwt->h[1]);
    pwd->h[2]  = msa_adds_s_df(DF_HALF, pws->h[2],  pwt->h[2]);
    pwd->h[3]  = msa_adds_s_df(DF_HALF, pws->h[3],  pwt->h[3]);
    pwd->h[4]  = msa_adds_s_df(DF_HALF, pws->h[4],  pwt->h[4]);
    pwd->h[5]  = msa_adds_s_df(DF_HALF, pws->h[5],  pwt->h[5]);
    pwd->h[6]  = msa_adds_s_df(DF_HALF, pws->h[6],  pwt->h[6]);
    pwd->h[7]  = msa_adds_s_df(DF_HALF, pws->h[7],  pwt->h[7]);
}